

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v7::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  char *in_RCX;
  v7 *in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  basic_string_view<char> s;
  runtime_error *base;
  memory_buffer buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_00;
  string local_340 [32];
  runtime_error local_320 [16];
  undefined1 local_2f8 [71];
  allocator<char> local_2b1 [445];
  int in_stack_ffffffffffffff0c;
  buffer<char> *in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff58;
  v7 *local_78;
  char *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string_view<char> local_40;
  v7 **local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  this->error_code_ = (int)ctx;
  local_78 = in_RDX;
  pcStack_70 = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffc90,(allocator<char> *)in_stack_fffffffffffffc88);
  std::allocator<char>::~allocator(local_2b1);
  local_18 = local_2f8;
  local_30 = &local_78;
  s.size_ = (size_t)local_18;
  s.data_ = pcStack_70;
  local_28 = in_R8;
  uStack_20 = in_R9;
  local_40 = to_string_view<char>(local_78,s);
  local_8 = &local_68;
  local_10 = &local_28;
  local_68 = local_28;
  uStack_60 = uStack_20;
  detail::vformat_abi_cxx11_(in_stack_ffffffffffffff58,(format_args)in_stack_ffffffffffffff48);
  this_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2f8;
  basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            ((basic_string_view<char> *)this_00,in_stack_fffffffffffffc88);
  format_system_error(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff18)
  ;
  std::__cxx11::string::~string((string *)this_00);
  to_string<char,500ul>((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)this);
  std::runtime_error::runtime_error(local_320,local_340);
  std::runtime_error::operator=(&this->super_runtime_error,local_320);
  std::runtime_error::~runtime_error(local_320);
  std::__cxx11::string::~string(local_340);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}